

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauGia.c
# Opt level: O1

int Dau_DsdBalance(Gia_Man_t *pGia,int *pFans,int nFans,int fAnd)

{
  uint iData0;
  int iVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  uint uVar8;
  uint *puVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  
  uVar12 = nFans - 2;
  puVar9 = (uint *)(pFans + (nFans - 1));
  do {
    if (uVar12 == 0xffffffff) {
      return *pFans;
    }
    if (nFans < 2) {
      __assert_fail("nFans > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauGia.c"
                    ,0xee,"int Dau_DsdBalance(Gia_Man_t *, int *, int, int)");
    }
    uVar5 = *puVar9;
    iData0 = pFans[uVar12];
    if ((pGia->vHTable).nSize == 0) {
      if (fAnd == 0) {
        if (pGia->pMuxes == (uint *)0x0) {
          if ((int)iData0 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x131,"int Abc_LitNot(int)");
          }
          uVar3 = Gia_ManAppendMux2(pGia,uVar5,iData0 ^ 1,iData0);
        }
        else {
          if (((int)uVar5 < 0) || ((int)iData0 < 0)) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x130,"int Abc_LitIsCompl(int)");
          }
          pGVar6 = Gia_ManAppendObj(pGia);
          uVar3 = uVar5 >> 1;
          iVar1 = pGia->nObjs;
          if (iVar1 <= (int)uVar3) {
            __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x2d4,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
          }
          uVar8 = iData0 >> 1;
          if (iVar1 <= (int)uVar8) {
            __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x2d5,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
          }
          if (uVar3 == uVar8) {
            __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x2d6,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
          }
          pGVar2 = pGia->pObjs;
          iVar4 = (int)pGVar6;
          if (uVar8 < uVar3) {
            if (pGVar2 + iVar1 <= pGVar6 || pGVar6 < pGVar2) goto LAB_00508cb7;
            uVar10 = (ulong)(((uint)(iVar4 - (int)pGVar2) >> 2) * -0x55555555 - uVar3 & 0x1fffffff)
                     | *(ulong *)pGVar6 & 0xffffffffc0000000;
            *(ulong *)pGVar6 = uVar10;
            pGVar2 = pGia->pObjs;
            if ((pGVar6 < pGVar2) || (pGVar2 + pGia->nObjs <= pGVar6)) goto LAB_00508cb7;
            uVar11 = (ulong)(((uint)(iVar4 - (int)pGVar2) >> 2) * -0x55555555 - uVar8 & 0x1fffffff)
                     << 0x20;
            uVar7 = 0xe0000000dfffffff;
          }
          else {
            if (pGVar2 + iVar1 <= pGVar6 || pGVar6 < pGVar2) goto LAB_00508cb7;
            uVar10 = *(ulong *)pGVar6 & 0xc0000000ffffffff |
                     (ulong)(((uint)(iVar4 - (int)pGVar2) >> 2) * -0x55555555 - uVar3 & 0x1fffffff)
                     << 0x20;
            *(ulong *)pGVar6 = uVar10;
            pGVar2 = pGia->pObjs;
            if ((pGVar6 < pGVar2) || (pGVar2 + pGia->nObjs <= pGVar6)) goto LAB_00508cb7;
            uVar11 = (ulong)(((uint)(iVar4 - (int)pGVar2) >> 2) * -0x55555555 - uVar8 & 0x1fffffff);
            uVar7 = 0xdfffffffe0000000;
          }
          *(ulong *)pGVar6 = uVar10 & uVar7 & 0xdfffffffdfffffff | uVar11;
          pGia->nXors = pGia->nXors + 1;
          pGVar2 = pGia->pObjs;
          if ((pGVar6 < pGVar2) || (pGVar2 + pGia->nObjs <= pGVar6)) {
LAB_00508cb7:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar3 = (int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * 0x55555556;
          if ((int)uVar3 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          uVar3 = uVar3 | (iData0 ^ uVar5) & 1;
        }
      }
      else if (pGia->fGiaSimple == 0) {
        uVar3 = iData0;
        if ((int)uVar5 < 2) {
          if (uVar5 == 0) {
            uVar3 = uVar5;
          }
        }
        else if ((int)iData0 < 2) {
          uVar3 = uVar5;
          if (iData0 == 0) {
            uVar3 = iData0;
          }
        }
        else if ((uVar5 != iData0) && (uVar3 = 0, (iData0 ^ uVar5) != 1)) goto LAB_005088e4;
      }
      else {
LAB_005088e4:
        uVar3 = Gia_ManAppendAnd(pGia,uVar5,iData0);
      }
    }
    else if (fAnd == 0) {
      if (pGia->pMuxes == (uint *)0x0) {
        uVar3 = Gia_ManHashXor(pGia,uVar5,iData0);
      }
      else {
        uVar3 = Gia_ManHashXorReal(pGia,uVar5,iData0);
      }
    }
    else {
      uVar3 = Gia_ManHashAnd(pGia,uVar5,iData0);
    }
    if ((int)uVar3 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    uVar5 = uVar3 >> 1;
    if (pGia->nObjs <= (int)uVar5) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    uVar10 = *(ulong *)(pGia->pObjs + uVar5);
    uVar7 = uVar10 & 0x1fffffff;
    if (uVar7 != 0x1fffffff && -1 < (int)uVar10) {
      pGVar6 = pGia->pObjs + uVar5;
      if (fAnd == 0) {
        if (pGia->pMuxes != (uint *)0x0) {
          Gia_ObjSetXorLevel(pGia,pGVar6);
          goto LAB_00508aad;
        }
        if ((~*(uint *)(pGVar6 + -uVar7) & 0x1fffffff) != 0 && -1 < (int)*(uint *)(pGVar6 + -uVar7))
        {
          Gia_ObjSetAndLevel(pGia,pGVar6 + -uVar7);
        }
        uVar10 = (ulong)(*(uint *)&pGVar6->field_0x4 & 0x1fffffff);
        if ((~*(uint *)(pGVar6 + -uVar10) & 0x1fffffff) != 0 &&
            -1 < (int)*(uint *)(pGVar6 + -uVar10)) {
          Gia_ObjSetAndLevel(pGia,pGVar6 + -uVar10);
        }
      }
      Gia_ObjSetAndLevel(pGia,pGVar6);
    }
LAB_00508aad:
    Dau_DsdAddToArray(pGia,pFans,nFans + -2,uVar3);
    uVar12 = uVar12 - 1;
    puVar9 = puVar9 + -1;
    nFans = nFans + -1;
  } while( true );
}

Assistant:

int Dau_DsdBalance( Gia_Man_t * pGia, int * pFans, int nFans, int fAnd )
{
    Gia_Obj_t * pObj;
    int iFan0, iFan1, iFan;
    if ( nFans == 1 )
        return pFans[0];
    assert( nFans > 1 );
    iFan0 = pFans[--nFans];
    iFan1 = pFans[--nFans];
    if ( Vec_IntSize(&pGia->vHTable) == 0 )
    {
        if ( fAnd )
            iFan = Gia_ManAppendAnd2( pGia, iFan0, iFan1 );
        else if ( pGia->pMuxes )
        {
            int fCompl = Abc_LitIsCompl(iFan0) ^ Abc_LitIsCompl(iFan1);
            iFan = Gia_ManAppendXorReal( pGia, Abc_LitRegular(iFan0), Abc_LitRegular(iFan1) );
            iFan = Abc_LitNotCond( iFan, fCompl );
        }
        else 
            iFan = Gia_ManAppendXor2( pGia, iFan0, iFan1 );
    }
    else
    {
        if ( fAnd )
            iFan = Gia_ManHashAnd( pGia, iFan0, iFan1 );
        else if ( pGia->pMuxes )
            iFan = Gia_ManHashXorReal( pGia, iFan0, iFan1 );
        else 
            iFan = Gia_ManHashXor( pGia, iFan0, iFan1 );
    }
    pObj = Gia_ManObj(pGia, Abc_Lit2Var(iFan));
    if ( Gia_ObjIsAnd(pObj) )
    {
        if ( fAnd )
            Gia_ObjSetAndLevel( pGia, pObj );
        else if ( pGia->pMuxes )
            Gia_ObjSetXorLevel( pGia, pObj );
        else 
        {
            if ( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) )
                Gia_ObjSetAndLevel( pGia, Gia_ObjFanin0(pObj) );
            if ( Gia_ObjIsAnd(Gia_ObjFanin1(pObj)) )
                Gia_ObjSetAndLevel( pGia, Gia_ObjFanin1(pObj) );
            Gia_ObjSetAndLevel( pGia, pObj );
        }
    }
    Dau_DsdAddToArray( pGia, pFans, nFans++, iFan );
    return Dau_DsdBalance( pGia, pFans, nFans, fAnd );
}